

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin.c
# Opt level: O2

int coda_bin_product_open(coda_bin_product *product)

{
  char *pcVar1;
  int iVar2;
  uint8_t *puVar3;
  int *piVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  
  product->use_mmap = 0;
  product->fd = -1;
  if ((*(int *)(in_FS_OFFSET + -0x11fc) == 0) || (product->file_size < 1)) {
    iVar2 = open(product->filename,0);
    product->fd = iVar2;
    if (-1 < iVar2) {
      return 0;
    }
  }
  else {
    product->use_mmap = 1;
    iVar2 = open(product->filename,0);
    if (-1 < iVar2) {
      puVar3 = (uint8_t *)mmap((void *)0x0,product->file_size,1,1,iVar2,0);
      product->mem_ptr = puVar3;
      if (puVar3 == (uint8_t *)0xffffffffffffffff) {
        pcVar1 = product->filename;
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        coda_set_error(-0x15,"could not map file %s into memory (%s)",pcVar1,pcVar5);
        product->mem_ptr = (uint8_t *)0x0;
        close(iVar2);
        return -1;
      }
      close(iVar2);
      product->mem_size = product->file_size;
      return 0;
    }
  }
  pcVar1 = product->filename;
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  coda_set_error(-0x15,"could not open file %s (%s)",pcVar1,pcVar5);
  return -1;
}

Assistant:

int coda_bin_product_open(coda_bin_product *product)
{
    product->use_mmap = 0;
    product->fd = -1;
#ifdef WIN32
    product->file_mapping = INVALID_HANDLE_VALUE;
    product->file = INVALID_HANDLE_VALUE;
#endif

    if (coda_option_use_mmap && product->file_size > 0)
    {
        /* Perform an mmap() of the file, filling the following fields:
         *   product->use_mem_ptr = 1
         *   product->file         (windows only )
         *   product->file_mapping (windows only )
         *   product->mem_ptr      (windows, *nix)
         */
#ifdef WIN32
        product->use_mmap = 1;
        product->file = CreateFile(product->filename, GENERIC_READ, FILE_SHARE_READ, NULL, OPEN_EXISTING,
                                   FILE_ATTRIBUTE_NORMAL, NULL);
        if (product->file == INVALID_HANDLE_VALUE)
        {
            if (GetLastError() == ERROR_FILE_NOT_FOUND)
            {
                coda_set_error(CODA_ERROR_FILE_NOT_FOUND, "could not find %s", product->filename);
            }
            else
            {
                LPVOID lpMsgBuf;

                if (FormatMessage(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM |
                                  FORMAT_MESSAGE_IGNORE_INSERTS, NULL, GetLastError(),
                                  MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT), (LPTSTR)&lpMsgBuf, 0, NULL) == 0)
                {
                    /* Set error without additional information */
                    coda_set_error(CODA_ERROR_FILE_OPEN, "could not open file %s", product->filename);
                }
                else
                {
                    coda_set_error(CODA_ERROR_FILE_OPEN, "could not open file %s (%s)", product->filename,
                                   (LPCTSTR) lpMsgBuf);
                    LocalFree(lpMsgBuf);
                }
            }
            return -1;  /* indicate failure */
        }

        /* Try to do file mapping */
        product->file_mapping = CreateFileMapping(product->file, NULL, PAGE_READONLY, 0,
                                                  (int32_t)product->file_size, 0);
        if (product->file_mapping == NULL)
        {
            LPVOID lpMsgBuf;

            if (FormatMessage(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM |
                              FORMAT_MESSAGE_IGNORE_INSERTS, NULL, GetLastError(),
                              MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT), (LPTSTR)&lpMsgBuf, 0, NULL) == 0)
            {
                /* Set error without additional information */
                coda_set_error(CODA_ERROR_FILE_OPEN, "could not map file %s into memory", product->filename);
            }
            else
            {
                coda_set_error(CODA_ERROR_FILE_OPEN, "could not map file %s into memory (%s)", product->filename,
                               (LPCTSTR) lpMsgBuf);
                LocalFree(lpMsgBuf);
            }
            return -1;
        }

        product->mem_ptr = (uint8_t *)MapViewOfFile(product->file_mapping, FILE_MAP_READ, 0, 0, 0);
        if (product->mem_ptr == NULL)
        {
            LPVOID lpMsgBuf;

            if (FormatMessage(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM |
                              FORMAT_MESSAGE_IGNORE_INSERTS, NULL, GetLastError(),
                              MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT), (LPTSTR)&lpMsgBuf, 0, NULL) == 0)
            {
                /* Set error without additional information */
                coda_set_error(CODA_ERROR_FILE_OPEN, "could not map file %s into memory", product->filename);
            }
            else
            {
                coda_set_error(CODA_ERROR_FILE_OPEN, "could not map file %s into memory (%s)", product->filename,
                               (LPCTSTR) lpMsgBuf);
                LocalFree(lpMsgBuf);
            }
            return -1;
        }
#else
        int fd;

        product->use_mmap = 1;
        fd = open(product->filename, O_RDONLY);
        if (fd < 0)
        {
            coda_set_error(CODA_ERROR_FILE_OPEN, "could not open file %s (%s)", product->filename, strerror(errno));
            return -1;
        }

        product->mem_ptr = (uint8_t *)mmap(0, product->file_size, PROT_READ, MAP_SHARED, fd, 0);
        if (product->mem_ptr == (uint8_t *)MAP_FAILED)
        {
            coda_set_error(CODA_ERROR_FILE_OPEN, "could not map file %s into memory (%s)", product->filename,
                           strerror(errno));
            product->mem_ptr = NULL;
            close(fd);
            return -1;
        }

        /* close file descriptor (the file handle is not needed anymore) */
        close(fd);
#endif
        product->mem_size = product->file_size;
    }
    else
    {
        int open_flags;

        /* Perform a normal open of the file, filling the following fields:
         *   product->use_mem_ptr = 0
         *   product->fd             (windows, *nix)
         */
        open_flags = O_RDONLY;
#ifdef WIN32
        open_flags |= _O_BINARY;
#endif
        product->fd = open(product->filename, open_flags);
        if (product->fd < 0)
        {
            coda_set_error(CODA_ERROR_FILE_OPEN, "could not open file %s (%s)", product->filename, strerror(errno));
            return -1;
        }
    }

    return 0;
}